

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

gdImagePtr gdImageScaleTwoPass(gdImagePtr src,uint new_width,uint new_height)

{
  uint src_len;
  uint num_lines;
  int iVar1;
  gdImagePtr pgVar2;
  gdImagePtr im;
  
  src_len = src->sx;
  num_lines = src->sy;
  if (num_lines == new_height && src_len == new_width) {
    pgVar2 = gdImageClone(src);
    return pgVar2;
  }
  if (src->trueColor == 0) {
    gdImagePaletteToTrueColor(src);
  }
  pgVar2 = src;
  if (src_len == new_width) {
LAB_0011a91b:
    if (num_lines == new_height) {
      return pgVar2;
    }
    im = gdImageCreateTrueColor(new_width,new_height);
    if (im != (gdImagePtr)0x0) {
      gdImageSetInterpolationMethod(im,src->interpolation_id);
      iVar1 = _gdScalePass(pgVar2,num_lines,im,new_height,new_width,VERTICAL);
      if (iVar1 == 0) {
        gdImageDestroy(im);
        if (pgVar2 != src) goto LAB_0011a97f;
        goto LAB_0011a987;
      }
    }
    if (pgVar2 != src) {
      gdImageDestroy(pgVar2);
    }
  }
  else {
    pgVar2 = gdImageCreateTrueColor(new_width,num_lines);
    if (pgVar2 != (gdImagePtr)0x0) {
      gdImageSetInterpolationMethod(pgVar2,src->interpolation_id);
      iVar1 = _gdScalePass(src,src_len,pgVar2,new_width,num_lines,HORIZONTAL);
      if (iVar1 != 0) goto LAB_0011a91b;
LAB_0011a97f:
      gdImageDestroy(pgVar2);
    }
LAB_0011a987:
    im = (gdImagePtr)0x0;
  }
  return im;
}

Assistant:

static gdImagePtr
gdImageScaleTwoPass(const gdImagePtr src, const unsigned int new_width,
                    const unsigned int new_height)
{
    const unsigned int src_width = src->sx;
    const unsigned int src_height = src->sy;
	gdImagePtr tmp_im = NULL;
	gdImagePtr dst = NULL;
	int scale_pass_res;

	assert(src != NULL);

    /* First, handle the trivial case. */
    if (src_width == new_width && src_height == new_height) {
        return gdImageClone(src);
    }/* if */

	/* Convert to truecolor if it isn't; this code requires it. */
	if (!src->trueColor) {
		gdImagePaletteToTrueColor(src);
	}/* if */

    /* Scale horizontally unless sizes are the same. */
    if (src_width == new_width) {
        tmp_im = src;
    } else {
        tmp_im = gdImageCreateTrueColor(new_width, src_height);
        if (tmp_im == NULL) {
            return NULL;
        }
        gdImageSetInterpolationMethod(tmp_im, src->interpolation_id);

		scale_pass_res = _gdScalePass(src, src_width, tmp_im, new_width, src_height, HORIZONTAL);
		if (scale_pass_res != 1) {
			gdImageDestroy(tmp_im);
			return NULL;
		}
    }/* if .. else*/

    /* If vertical sizes match, we're done. */
    if (src_height == new_height) {
        assert(tmp_im != src);
        return tmp_im;
    }/* if */

    /* Otherwise, we need to scale vertically. */
	dst = gdImageCreateTrueColor(new_width, new_height);
	if (dst != NULL) {
        gdImageSetInterpolationMethod(dst, src->interpolation_id);
        scale_pass_res = _gdScalePass(tmp_im, src_height, dst, new_height, new_width, VERTICAL);
		if (scale_pass_res != 1) {
			gdImageDestroy(dst);
			if (src != tmp_im) {
				gdImageDestroy(tmp_im);
			}
			return NULL;
	   }
    }/* if */


	if (src != tmp_im) {
        gdImageDestroy(tmp_im);
    }/* if */

	return dst;
}